

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jint Java_beagle_BeagleJNIWrapper_updateTransitionMatricesWithMultipleModels
               (JNIEnv *env,jobject obj,jint instance,jintArray inEigenIndices,
               jintArray inCategoryRateIndices,jintArray inProbabilityIndices,
               jintArray inFirstDerivativeIndices,jintArray inSecondDerivativeIndices,
               jdoubleArray inEdgeLengths,jint count)

{
  jint jVar1;
  jint *pjVar2;
  jint *pjVar3;
  jint *pjVar4;
  jint *pjVar5;
  jint *pjVar6;
  jdouble *pjVar7;
  
  pjVar5 = (jint *)0x0;
  pjVar2 = (*env->functions->GetIntArrayElements)(env,inEigenIndices,(jboolean *)0x0);
  pjVar3 = (*env->functions->GetIntArrayElements)(env,inCategoryRateIndices,(jboolean *)0x0);
  pjVar4 = (*env->functions->GetIntArrayElements)(env,inProbabilityIndices,(jboolean *)0x0);
  if (inFirstDerivativeIndices != (jintArray)0x0) {
    pjVar5 = (*env->functions->GetIntArrayElements)(env,inFirstDerivativeIndices,(jboolean *)0x0);
  }
  if (inSecondDerivativeIndices == (jintArray)0x0) {
    pjVar6 = (jint *)0x0;
  }
  else {
    pjVar6 = (*env->functions->GetIntArrayElements)(env,inSecondDerivativeIndices,(jboolean *)0x0);
  }
  pjVar7 = (*env->functions->GetDoubleArrayElements)(env,inEdgeLengths,(jboolean *)0x0);
  jVar1 = beagleUpdateTransitionMatricesWithMultipleModels
                    (instance,pjVar2,pjVar3,pjVar4,pjVar5,pjVar6,pjVar7,count);
  (*env->functions->ReleaseDoubleArrayElements)(env,inEdgeLengths,pjVar7,2);
  if (inSecondDerivativeIndices != (jintArray)0x0) {
    (*env->functions->ReleaseIntArrayElements)(env,inSecondDerivativeIndices,pjVar6,2);
  }
  if (inFirstDerivativeIndices != (jintArray)0x0) {
    (*env->functions->ReleaseIntArrayElements)(env,inFirstDerivativeIndices,pjVar5,2);
  }
  (*env->functions->ReleaseIntArrayElements)(env,inProbabilityIndices,pjVar4,2);
  (*env->functions->ReleaseIntArrayElements)(env,inCategoryRateIndices,pjVar3,2);
  (*env->functions->ReleaseIntArrayElements)(env,inEigenIndices,pjVar2,2);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_updateTransitionMatricesWithMultipleModels
  (JNIEnv *env, jobject obj, jint instance, jintArray inEigenIndices, jintArray inCategoryRateIndices, jintArray inProbabilityIndices, jintArray inFirstDerivativeIndices, jintArray inSecondDerivativeIndices, jdoubleArray inEdgeLengths, jint count)
{
    jint *eigenIndices = env->GetIntArrayElements(inEigenIndices, NULL);
    jint *categoryRateIndices = env->GetIntArrayElements(inCategoryRateIndices, NULL);
    jint *probabilityIndices = env->GetIntArrayElements(inProbabilityIndices, NULL);
    jint *firstDerivativeIndices = inFirstDerivativeIndices != NULL ? env->GetIntArrayElements(inFirstDerivativeIndices, NULL) : NULL;
    jint *secondDerivativeIndices = inSecondDerivativeIndices != NULL ? env->GetIntArrayElements(inSecondDerivativeIndices, NULL) : NULL;
    jdouble *edgeLengths = env->GetDoubleArrayElements(inEdgeLengths, NULL);
    jint errCode = (jint)beagleUpdateTransitionMatricesWithMultipleModels(instance, (int *)eigenIndices, (int *)categoryRateIndices, (int *)probabilityIndices, (int *)firstDerivativeIndices, (int *)secondDerivativeIndices, (double *)edgeLengths, count);

    env->ReleaseDoubleArrayElements(inEdgeLengths, edgeLengths, JNI_ABORT);
    if (inSecondDerivativeIndices != NULL) env->ReleaseIntArrayElements(inSecondDerivativeIndices, secondDerivativeIndices, JNI_ABORT);
    if (inFirstDerivativeIndices != NULL) env->ReleaseIntArrayElements(inFirstDerivativeIndices, firstDerivativeIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inProbabilityIndices, probabilityIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inCategoryRateIndices, categoryRateIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inEigenIndices, eigenIndices, JNI_ABORT);

    return errCode;
}